

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

mg_connection * mg_do_connect(mg_connection *nc,int proto,socket_address *sa)

{
  uint16_t uVar1;
  char *pcVar2;
  char *pcVar3;
  socket_address *sa_local;
  int proto_local;
  mg_connection *nc_local;
  
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_do_connect");
    pcVar2 = "tcp";
    if (proto == 2) {
      pcVar2 = "udp";
    }
    pcVar3 = inet_ntoa((in_addr)(sa->sin).sin_addr.s_addr);
    uVar1 = ntohs((sa->sin).sin_port);
    cs_log_printf("%p %s://%s:%hu",nc,pcVar2,pcVar3,(ulong)uVar1);
  }
  nc->flags = nc->flags | 8;
  if (proto == 2) {
    mg_if_connect_udp(nc);
  }
  else {
    mg_if_connect_tcp(nc,sa);
  }
  mg_add_conn(nc->mgr,nc);
  return nc;
}

Assistant:

mg_connection *mg_do_connect(struct mg_connection *nc,
                                                int proto,
                                                union socket_address *sa) {
    DBG(("%p %s://%s:%hu", nc, proto == SOCK_DGRAM ? "udp" : "tcp",
            inet_ntoa(sa->sin.sin_addr), ntohs(sa->sin.sin_port)));

    nc->flags |= MG_F_CONNECTING;
    if (proto == SOCK_DGRAM) {
        mg_if_connect_udp(nc);
    } else {
        mg_if_connect_tcp(nc, sa);
    }
    mg_add_conn(nc->mgr, nc);
    return nc;
}